

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_>::insert
          (map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *this,
          Node *node)

{
  value_type *pvVar1;
  bool bVar2;
  Node *pNVar3;
  undefined8 *in_RSI;
  Node *in_RDI;
  Node *y;
  Node *x;
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *local_30;
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *this_00;
  map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *local_18;
  
  this_00 = (map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)
            in_RDI->value;
  local_18 = (map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)
             in_RDI->value[1].first;
  while (local_18 !=
         (map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)in_RDI->value)
  {
    this_00 = local_18;
    bVar2 = std::less<long>::operator()
                      ((less<long> *)&in_RDI->left,(long *)*in_RSI,(long *)local_18->nil);
    if (bVar2) {
      local_30 = *(map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> **)
                  &local_18->field_0x10;
    }
    else {
      local_30 = (map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)
                 local_18->tot;
    }
    local_18 = local_30;
  }
  if (this_00 !=
      (map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)in_RDI->value) {
    bVar2 = std::less<long>::operator()
                      ((less<long> *)&in_RDI->left,(long *)*in_RSI,(long *)this_00->nil);
    if (!bVar2) {
      this_00->tot = (size_t)in_RSI;
      goto LAB_00126b96;
    }
  }
  *(undefined8 **)&this_00->field_0x10 = in_RSI;
LAB_00126b96:
  pvVar1 = in_RDI->value;
  in_RSI[3] = pvVar1;
  in_RSI[2] = pvVar1;
  in_RSI[4] = this_00;
  in_RDI->right = (Node *)((long)&in_RDI->right->value + 1);
  insert_fixup(this_00,in_RDI);
  in_RDI->value[2].first = (long)in_RDI->value;
  pNVar3 = findmin((map<long,_sjtu::LRUCache<sjtu::trainType>::CacheNode_*,_std::less<long>_> *)
                   in_RDI,(Node *)in_RDI->value);
  *(Node **)&in_RDI->color = pNVar3;
  return;
}

Assistant:

void insert(Node * const node)//node -> color == RED
	{
		Node *x = nil -> left , *y = nil;
		for (;x != nil;y = x , x = compare(node -> value -> first , x -> value -> first) ? x -> left : x -> right);
		if (y == nil || compare(node -> value -> first , y -> value -> first)) y -> left = node;
		else y -> right = node;
		node -> left = node -> right = nil , node -> parent = y;
		++ tot , insert_fixup(node) , nil -> parent = nil , nodebegin = findmin(nil);
	}